

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

int32_t __thiscall
charls::jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
::do_run_mode(jls_codec<charls::lossless_traits<charls::quad<unsigned_char>,_8>,_charls::encoder_strategy>
              *this,int32_t index,encoder_strategy *param_2)

{
  pixel_type *ppVar1;
  pixel_type *ppVar2;
  quad<unsigned_char> qVar3;
  int iVar4;
  uint run_length;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  
  uVar7 = this->width_ - index;
  ppVar1 = this->current_line_;
  ppVar2 = this->previous_line_;
  qVar3 = ppVar1[(long)index + -1];
  uVar5 = 0;
  do {
    uVar6 = uVar5;
    if (((uint)ppVar1[(long)index + uVar5] & 0xffffff) != ((uint)qVar3 & 0xffffff)) break;
    ppVar1[(long)index + uVar5] = qVar3;
    uVar5 = uVar5 + 1;
    uVar6 = (ulong)uVar7;
  } while (uVar7 != uVar5);
  run_length = (uint)uVar6;
  encode_run_pixels(this,run_length,run_length == uVar7);
  if (run_length != uVar7) {
    qVar3 = encode_run_interruption_pixel
                      (this,ppVar1[(long)index + (long)(int)run_length],qVar3,
                       ppVar2[(long)index + (long)(int)run_length]);
    ppVar1[(long)index + (long)(int)run_length] = qVar3;
    iVar4 = 1;
    if (1 < this->run_index_) {
      iVar4 = this->run_index_;
    }
    this->run_index_ = iVar4 + -1;
    uVar7 = run_length + 1;
  }
  return uVar7;
}

Assistant:

int32_t do_run_mode(const int32_t index, encoder_strategy* /*strategy*/)
    {
        const int32_t count_type_remain = width_ - index;
        pixel_type* type_cur_x{current_line_ + index};
        const pixel_type* type_prev_x{previous_line_ + index};

        const pixel_type ra{type_cur_x[-1]};

        int32_t run_length{};
        while (traits_.is_near(type_cur_x[run_length], ra))
        {
            type_cur_x[run_length] = ra;
            ++run_length;

            if (run_length == count_type_remain)
                break;
        }

        encode_run_pixels(run_length, run_length == count_type_remain);

        if (run_length == count_type_remain)
            return run_length;

        type_cur_x[run_length] = encode_run_interruption_pixel(type_cur_x[run_length], ra, type_prev_x[run_length]);
        decrement_run_index();
        return run_length + 1;
    }